

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          String *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,CappedArray<char,_8UL> *rest_5,ArrayPtr<const_char> *rest_6)

{
  Array<char> *pAVar1;
  size_t pos_00;
  char *pcVar2;
  Branch *pBVar3;
  String *pSVar4;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  CappedArray<char,_8UL> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  StringTree local_78;
  String *local_40;
  String *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  String *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_40 = rest_1;
  rest_local_1 = (String *)rest;
  rest_local = (ArrayPtr<const_char> *)first;
  first_local = (String *)branchIndex;
  branchIndex_local = (size_t)pos;
  pos_local = (char *)this;
  pcVar2 = String::begin(&this->text);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  pBVar3->index = (long)pos - (long)pcVar2;
  pSVar4 = mv<kj::String>((String *)rest_local);
  StringTree(&local_78,pSVar4);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  operator=(&pBVar3->content,&local_78);
  ~StringTree(&local_78);
  pos_00 = branchIndex_local;
  pAVar1 = &first_local->content;
  first_00 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)rest_local_1);
  pSVar4 = fwd<kj::String>(local_40);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::CappedArray<char,8ul>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (this,(char *)pos_00,(size_t)((long)&pAVar1->ptr + 1),first_00,pSVar4,rest_1_00,
             rest_2_00,rest_3_00,rest_4_00,rest_5_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}